

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall solitaire::graphics::Renderer::renderPiles(Renderer *this)

{
  uint *puVar1;
  PileId local_28;
  uint local_24;
  PileId local_20;
  PileId local_1c;
  PileId id_1;
  PileId local_14;
  Renderer *pRStack_10;
  PileId id;
  Renderer *this_local;
  
  id_1.t = 0;
  pRStack_10 = this;
  piles::PileId::PileId(&local_14,&id_1.t);
  while( true ) {
    puVar1 = piles::PileId::operator_cast_to_unsigned_int_(&local_14);
    if (3 < *puVar1) break;
    piles::PileId::PileId(&local_1c,&local_14);
    renderFoundationPile(this,&local_1c);
    puVar1 = piles::PileId::operator_cast_to_unsigned_int_(&local_14);
    *puVar1 = *puVar1 + 1;
  }
  local_24 = 0;
  piles::PileId::PileId(&local_20,&local_24);
  while( true ) {
    puVar1 = piles::PileId::operator_cast_to_unsigned_int_(&local_20);
    if (6 < *puVar1) break;
    piles::PileId::PileId(&local_28,&local_20);
    renderTableauPile(this,&local_28);
    puVar1 = piles::PileId::operator_cast_to_unsigned_int_(&local_20);
    *puVar1 = *puVar1 + 1;
  }
  renderStockPile(this);
  renderCardsInHand(this);
  return;
}

Assistant:

void Renderer::renderPiles() const {
    for (PileId id {0}; id < Solitaire::foundationPilesCount; ++id)
        renderFoundationPile(id);

    for (PileId id {0}; id < Solitaire::tableauPilesCount; ++id)
        renderTableauPile(id);

    renderStockPile();
    renderCardsInHand();
}